

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
spirv_cross::Compiler::InterlockedResourceAccessPrepassHandler::handle
          (InterlockedResourceAccessPrepassHandler *this,Op op,uint32_t *param_2,uint32_t param_3)

{
  uint32_t id;
  bool bVar1;
  CFG *this_00;
  SPIRFunction *pSVar2;
  bool bVar3;
  
  bVar3 = true;
  if ((op & ~OpUndef) == OpBeginInvocationInterlockEXT) {
    if ((this->interlock_function_id == 0) ||
       (this->interlock_function_id ==
        (this->call_stack).super_VectorView<unsigned_int>.ptr
        [(this->call_stack).super_VectorView<unsigned_int>.buffer_size - 1])) {
      id = (this->call_stack).super_VectorView<unsigned_int>.ptr
           [(this->call_stack).super_VectorView<unsigned_int>.buffer_size - 1];
      this->interlock_function_id = id;
      this_00 = get_cfg_for_function(this->compiler,id);
      pSVar2 = Variant::get<spirv_cross::SPIRFunction>
                         ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                          this->interlock_function_id);
      bVar1 = CFG::node_terminates_control_flow_in_sub_graph
                        (this_00,(BlockID)(pSVar2->entry_block).id,(BlockID)this->current_block_id);
      if (!bVar1) {
        this->control_flow_interlock = true;
      }
    }
    else {
      this->split_function_case = true;
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool Compiler::InterlockedResourceAccessPrepassHandler::handle(Op op, const uint32_t *, uint32_t)
{
	if (op == OpBeginInvocationInterlockEXT || op == OpEndInvocationInterlockEXT)
	{
		if (interlock_function_id != 0 && interlock_function_id != call_stack.back())
		{
			// Most complex case, we have no sensible way of dealing with this
			// other than taking the 100% conservative approach, exit early.
			split_function_case = true;
			return false;
		}
		else
		{
			interlock_function_id = call_stack.back();
			// If this call is performed inside control flow we have a problem.
			auto &cfg = compiler.get_cfg_for_function(interlock_function_id);

			uint32_t from_block_id = compiler.get<SPIRFunction>(interlock_function_id).entry_block;
			bool outside_control_flow = cfg.node_terminates_control_flow_in_sub_graph(from_block_id, current_block_id);
			if (!outside_control_flow)
				control_flow_interlock = true;
		}
	}
	return true;
}